

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_statistics.cpp
# Opt level: O3

bool duckdb::ParquetStatisticsUtils::BloomFilterSupported(LogicalTypeId *type_id)

{
  return (bool)((byte)(0xf6c07800 >> (*type_id & UBIGINT)) & *type_id < TIMESTAMP_TZ);
}

Assistant:

bool ParquetStatisticsUtils::BloomFilterSupported(const LogicalTypeId &type_id) {
	switch (type_id) {
	case LogicalTypeId::TINYINT:
	case LogicalTypeId::UTINYINT:
	case LogicalTypeId::SMALLINT:
	case LogicalTypeId::USMALLINT:
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::UINTEGER:
	case LogicalTypeId::BIGINT:
	case LogicalTypeId::UBIGINT:
	case LogicalTypeId::FLOAT:
	case LogicalTypeId::DOUBLE:
	case LogicalTypeId::VARCHAR:
	case LogicalTypeId::BLOB:
		return true;
	default:
		return false;
	}
}